

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyLinkError
               (NegativeTestContext *ctx,ShaderProgram *program)

{
  ostringstream *this;
  TestLog *log;
  allocator<char> local_199;
  undefined1 local_198 [384];
  
  log = (ctx->super_CallLogWrapper).m_log;
  glu::operator<<(log,program);
  if ((program->m_program).m_info.linkOk == true) {
    this = (ostringstream *)(local_198 + 8);
    local_198._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Program was not expected to link.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,"Program was not expected to link.",&local_199);
    NegativeTestContext::fail(ctx,(string *)local_198);
    std::__cxx11::string::~string((string *)local_198);
  }
  return;
}

Assistant:

void verifyLinkError (NegativeTestContext& ctx, const glu::ShaderProgram& program)
{
	bool testFailed = false;

	tcu::TestLog& log = ctx.getLog();
	log << program;

	testFailed = program.getProgramInfo().linkOk;

	if (testFailed)
	{
		const char* const message("Program was not expected to link.");
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		ctx.fail(message);
	}
}